

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Select * sqlite3SelectDup(sqlite3 *db,Select *pDup,int flags)

{
  With *pWVar1;
  Select *pSVar2;
  ExprList *pEVar3;
  SrcList *pSVar4;
  Expr *pEVar5;
  With *pWVar6;
  Select *pSVar7;
  char *pcVar8;
  Select **ppSVar9;
  long lVar10;
  long lVar11;
  Select *pSVar12;
  Select *pRet;
  Select *local_40;
  Select *local_38;
  
  local_40 = (Select *)0x0;
  if (pDup != (Select *)0x0) {
    ppSVar9 = &local_40;
    pSVar7 = (Select *)0x0;
    do {
      pSVar2 = (Select *)sqlite3DbMallocRawNN(db,0x70);
      pSVar12 = pSVar2;
      if (pSVar2 != (Select *)0x0) {
        pEVar3 = sqlite3ExprListDup(db,pDup->pEList,flags);
        pSVar2->pEList = pEVar3;
        pSVar4 = sqlite3SrcListDup(db,pDup->pSrc,flags);
        pSVar2->pSrc = pSVar4;
        if (pDup->pWhere == (Expr *)0x0) {
          pEVar5 = (Expr *)0x0;
        }
        else {
          pEVar5 = exprDup(db,pDup->pWhere,flags,(u8 **)0x0);
        }
        pSVar2->pWhere = pEVar5;
        pEVar3 = sqlite3ExprListDup(db,pDup->pGroupBy,flags);
        pSVar2->pGroupBy = pEVar3;
        if (pDup->pHaving == (Expr *)0x0) {
          pEVar5 = (Expr *)0x0;
        }
        else {
          pEVar5 = exprDup(db,pDup->pHaving,flags,(u8 **)0x0);
        }
        pSVar2->pHaving = pEVar5;
        pEVar3 = sqlite3ExprListDup(db,pDup->pOrderBy,flags);
        pSVar2->pOrderBy = pEVar3;
        pSVar2->op = pDup->op;
        pSVar2->pNext = pSVar7;
        pSVar2->pPrior = (Select *)0x0;
        if (pDup->pLimit == (Expr *)0x0) {
          pEVar5 = (Expr *)0x0;
        }
        else {
          pEVar5 = exprDup(db,pDup->pLimit,flags,(u8 **)0x0);
        }
        pSVar2->pLimit = pEVar5;
        local_38 = pSVar2;
        if (pDup->pOffset == (Expr *)0x0) {
          pEVar5 = (Expr *)0x0;
        }
        else {
          pEVar5 = exprDup(db,pDup->pOffset,flags,(u8 **)0x0);
        }
        pSVar2->pOffset = pEVar5;
        pSVar2->iLimit = 0;
        pSVar2->iOffset = 0;
        pSVar2->selFlags = pDup->selFlags & 0xffffffdf;
        pSVar2->addrOpenEphm[0] = -1;
        pSVar2->addrOpenEphm[1] = -1;
        pSVar2->nSelectRow = pDup->nSelectRow;
        pWVar1 = pDup->pWith;
        if (pWVar1 == (With *)0x0) {
          pWVar6 = (With *)0x0;
        }
        else {
          pWVar6 = (With *)sqlite3DbMallocZero(db,(long)(int)(pWVar1->nCte << 5 | 0x10));
          if ((pWVar6 != (With *)0x0) && (pWVar6->nCte = pWVar1->nCte, 0 < pWVar1->nCte)) {
            lVar10 = 0x20;
            lVar11 = 0;
            do {
              pSVar7 = sqlite3SelectDup(db,*(Select **)((long)pWVar1->a + lVar10 + -0x10),0);
              *(Select **)((long)pWVar6->a + lVar10 + -0x10) = pSVar7;
              pEVar3 = sqlite3ExprListDup(db,*(ExprList **)((long)pWVar1->a + lVar10 + -0x18),0);
              *(ExprList **)((long)pWVar6->a + lVar10 + -0x18) = pEVar3;
              pcVar8 = sqlite3DbStrDup(db,*(char **)((long)(pWVar1->a + -1) + lVar10));
              *(char **)((long)(pWVar6->a + -1) + lVar10) = pcVar8;
              lVar11 = lVar11 + 1;
              lVar10 = lVar10 + 0x20;
            } while (lVar11 < pWVar1->nCte);
          }
        }
        pSVar2->pWith = pWVar6;
        *ppSVar9 = pSVar2;
        ppSVar9 = &local_38->pPrior;
        pSVar12 = local_38;
        pSVar7 = pSVar2;
      }
    } while ((pSVar12 != (Select *)0x0) && (pDup = pDup->pPrior, pDup != (Select *)0x0));
  }
  return local_40;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectDup(sqlite3 *db, Select *pDup, int flags){
  Select *pRet = 0;
  Select *pNext = 0;
  Select **pp = &pRet;
  Select *p;

  assert( db!=0 );
  for(p=pDup; p; p=p->pPrior){
    Select *pNew = sqlite3DbMallocRawNN(db, sizeof(*p) );
    if( pNew==0 ) break;
    pNew->pEList = sqlite3ExprListDup(db, p->pEList, flags);
    pNew->pSrc = sqlite3SrcListDup(db, p->pSrc, flags);
    pNew->pWhere = sqlite3ExprDup(db, p->pWhere, flags);
    pNew->pGroupBy = sqlite3ExprListDup(db, p->pGroupBy, flags);
    pNew->pHaving = sqlite3ExprDup(db, p->pHaving, flags);
    pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, flags);
    pNew->op = p->op;
    pNew->pNext = pNext;
    pNew->pPrior = 0;
    pNew->pLimit = sqlite3ExprDup(db, p->pLimit, flags);
    pNew->pOffset = sqlite3ExprDup(db, p->pOffset, flags);
    pNew->iLimit = 0;
    pNew->iOffset = 0;
    pNew->selFlags = p->selFlags & ~SF_UsesEphemeral;
    pNew->addrOpenEphm[0] = -1;
    pNew->addrOpenEphm[1] = -1;
    pNew->nSelectRow = p->nSelectRow;
    pNew->pWith = withDup(db, p->pWith);
    sqlite3SelectSetName(pNew, p->zSelName);
    *pp = pNew;
    pp = &pNew->pPrior;
    pNext = pNew;
  }

  return pRet;
}